

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O1

void __thiscall SubExpr::print(SubExpr *this)

{
  Token local_88;
  
  ExprNode::token(&local_88,&this->super_ExprNode);
  Token::print(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._string._M_dataplus._M_p != &local_88._string.field_2) {
    operator_delete(local_88._string._M_dataplus._M_p,
                    local_88._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._relOp._M_dataplus._M_p != &local_88._relOp.field_2) {
    operator_delete(local_88._relOp._M_dataplus._M_p,
                    local_88._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._name._M_dataplus._M_p._1_7_,local_88._name._M_dataplus._M_p._0_1_) !=
      &local_88._name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_88._name._M_dataplus._M_p._1_7_,
                             local_88._name._M_dataplus._M_p._0_1_),
                    local_88._name.field_2._M_allocated_capacity + 1);
  }
  local_88._name._M_dataplus._M_p._0_1_ = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_88,1);
  (**this->_test->_vptr_ExprNode)();
  local_88._name._M_dataplus._M_p._0_1_ = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_88,1);
  return;
}

Assistant:

void SubExpr::print() {
    token().print();
    std::cout << '[';
    _test->print();//index
    std::cout << ']';
}